

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

IterateResult __thiscall gl3cts::InvalidVSInputsTest::iterate(InvalidVSInputsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  _test_iteration iteration;
  char *pcVar6;
  GLint compile_status;
  string body;
  char *body_raw_ptr;
  int local_1fc;
  string local_1f8;
  string local_1d8;
  char *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  pcVar6 = "glCreateShader() call failed.";
  glu::checkError(dVar4,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x57d);
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar1 = true;
  iteration = TEST_ITERATION_FIRST;
  do {
    getShaderBody_abi_cxx11_(&local_1f8,(InvalidVSInputsTest *)pcVar6,iteration);
    local_1b8 = local_1f8._M_dataplus._M_p;
    local_1fc = 0;
    (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&local_1b8,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x58a);
    (**(code **)(lVar5 + 0x248))(this->m_vs_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x58e);
    (**(code **)(lVar5 + 0xa70))(this->m_vs_id,0x8b81,&local_1fc);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    pcVar6 = "glGetShaderiv() call failed.";
    glu::checkError(dVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x591);
    if (local_1fc == 1) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      pcVar6 = "The following vertex shader, used for test iteration [";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"The following vertex shader, used for test iteration [",0x36);
      getIterationName_abi_cxx11_(&local_1d8,(InvalidVSInputsTest *)pcVar6,iteration);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "] was compiled successfully, even though it is invalid. Body:\n>>\n",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n<<\n",4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = &std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      pcVar6 = (char *)(local_1f8.field_2._M_allocated_capacity + 1);
      operator_delete(local_1f8._M_dataplus._M_p,(ulong)pcVar6);
    }
    iteration = iteration + TEST_ITERATION_INVALID_BVEC2_INPUT;
  } while (iteration != TEST_ITERATION_COUNT);
  pcVar6 = "Fail";
  if (bVar1) {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar1 & QP_TEST_RESULT_FAIL,pcVar6);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidVSInputsTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Create a vertex shader object */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); current_iteration++)
	{
		const std::string body			 = getShaderBody(static_cast<_test_iteration>(current_iteration));
		const char*		  body_raw_ptr   = body.c_str();
		glw::GLint		  compile_status = GL_FALSE;

		/* Assign the source code to the SO */
		gl.shaderSource(m_vs_id, 1,				 /* count */
						&body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following vertex shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}